

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O1

void SetPortal(sector_t *sector,int plane,uint pnum,double alpha)

{
  double dVar1;
  int iVar2;
  FTextureID FVar3;
  FSectorPortal *pFVar4;
  msecnode_t *pmVar5;
  
  pFVar4 = sectorPortals.Array;
  if ((0 < plane) && (sectorPortals.Array[sector->Portals[1]].mType == 0)) {
    sector->Portals[1] = pnum;
    dVar1 = sector->planes[1].alpha;
    if ((dVar1 == 1.0) && (!NAN(dVar1))) {
      sector->planes[1].alpha = alpha;
    }
    if ((pFVar4[pnum].mFlags & 1) != 0) {
      sector->planes[1].Texture.texnum = skyflatnum.texnum;
    }
  }
  pFVar4 = sectorPortals.Array;
  if ((plane & 0xfffffffdU) == 0) {
    if (sectorPortals.Array[sector->Portals[0]].mType == 0) {
      sector->Portals[0] = pnum;
    }
    dVar1 = sector->planes[0].alpha;
    if ((dVar1 == 1.0) && (!NAN(dVar1))) {
      sector->planes[0].alpha = alpha;
    }
    FVar3.texnum = skyflatnum.texnum;
    if (((pFVar4[pnum].mFlags & 1) != 0) &&
       (iVar2 = sector->planes[0].Texture.texnum,
       sector->planes[0].Texture.texnum = skyflatnum.texnum, iVar2 != FVar3.texnum)) {
      for (pmVar5 = sector->touching_thinglist; pmVar5 != (msecnode_t *)0x0;
          pmVar5 = pmVar5->m_snext) {
        if (((pmVar5->m_thing->flags2).Value & 0x20) != 0) {
          AActor::AdjustFloorClip(pmVar5->m_thing);
        }
      }
      return;
    }
  }
  return;
}

Assistant:

static void SetPortal(sector_t *sector, int plane, unsigned pnum, double alpha)
{
	// plane: 0=floor, 1=ceiling, 2=both
	if (plane > 0)
	{
		if (sector->GetPortalType(sector_t::ceiling) == PORTS_SKYVIEWPOINT)
		{
			sector->Portals[sector_t::ceiling] = pnum;
			if (sector->GetAlpha(sector_t::ceiling) == 1.)
				sector->SetAlpha(sector_t::ceiling, alpha);

			if (sectorPortals[pnum].mFlags & PORTSF_SKYFLATONLY)
				sector->SetTexture(sector_t::ceiling, skyflatnum);
		}
	}
	if (plane == 2 || plane == 0)
	{
		if (sector->GetPortalType(sector_t::floor) == PORTS_SKYVIEWPOINT)
		{
			sector->Portals[sector_t::floor] = pnum;
		}
		if (sector->GetAlpha(sector_t::floor) == 1.)
			sector->SetAlpha(sector_t::floor, alpha);

		if (sectorPortals[pnum].mFlags & PORTSF_SKYFLATONLY)
			sector->SetTexture(sector_t::floor, skyflatnum);
	}
}